

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O1

void test_normc<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *orig,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *normal,norm_type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pwVar2;
  pointer pwVar3;
  size_type sVar4;
  int iVar5;
  converter<wchar_t> *pcVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  pointer pwVar9;
  bool bVar10;
  locale l;
  string local_60;
  string local_40 [8];
  generator local_38 [8];
  
  booster::locale::generator::generator(local_38);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"en_US.UTF-8","");
  booster::locale::generator::generate(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  booster::locale::generator::~generator(local_38);
  test_counter = test_counter + 1;
  pcVar6 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  pwVar9 = (orig->_M_dataplus)._M_p;
  (**(code **)(*(long *)pcVar6 + 0x10))
            (&local_60,pcVar6,0,pwVar9,pwVar9 + orig->_M_string_length,type);
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar10 = true;
    }
    else {
      iVar5 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar10 = iVar5 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (!bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," normalize(orig,type,l)==normal",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar10 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar10) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar3 = (orig->_M_dataplus)._M_p;
  pwVar9 = pwVar3 + -1;
  do {
    pwVar2 = pwVar9 + 1;
    pwVar9 = pwVar9 + 1;
  } while (*pwVar2 != L'\0');
  pcVar6 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  (**(code **)(*(long *)pcVar6 + 0x10))(&local_60,pcVar6,0,pwVar3,pwVar9,type);
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar10 = true;
    }
    else {
      iVar5 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar10 = iVar5 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (!bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," normalize(orig.c_str(),type,l)==normal",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar10 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar10) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar9 = (orig->_M_dataplus)._M_p;
  sVar4 = orig->_M_string_length;
  pcVar6 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  (**(code **)(*(long *)pcVar6 + 0x10))(&local_60,pcVar6,0,pwVar9,pwVar9 + sVar4,type);
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar10 = true;
    }
    else {
      iVar5 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar10 = iVar5 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (!bVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar10 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar10) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar8,&local_60);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale((locale *)local_40);
  return;
}

Assistant:

void test_normc(std::basic_string<Char> orig,std::basic_string<Char> normal,booster::locale::norm_type type)
{
    std::locale l = booster::locale::generator().generate("en_US.UTF-8");
    TEST(normalize(orig,type,l)==normal);
    TEST(normalize(orig.c_str(),type,l)==normal);
    TEST(normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal);
}